

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

void pollAbsState(_GLFWjoystick *js)

{
  int iVar1;
  long in_RDI;
  input_absinfo *info;
  int in_stack_00000008;
  int code;
  int local_c;
  
  for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
    if ((-1 < *(int *)(in_RDI + 0x18f4 + (long)local_c * 4)) &&
       (iVar1 = ioctl(*(int *)(in_RDI + 0xf0),(ulong)(local_c + 0x40U | 0x80004500) | 0x180000,
                      in_RDI + 0x19f4 + (long)local_c * 0x18), -1 < iVar1)) {
      handleAbsEvent(js,code,in_stack_00000008);
    }
  }
  return;
}

Assistant:

static void pollAbsState(_GLFWjoystick* js)
{
    for (int code = 0;  code < ABS_CNT;  code++)
    {
        if (js->linjs.absMap[code] < 0)
            continue;

        struct input_absinfo* info = &js->linjs.absInfo[code];

        if (ioctl(js->linjs.fd, EVIOCGABS(code), info) < 0)
            continue;

        handleAbsEvent(js, code, info->value);
    }
}